

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_ObjHasCutWithSize(Jf_Cut_t **pSto,int c,int nSize)

{
  Jf_Cut_t **ppJVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)c;
  if (c < 1) {
    uVar2 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return 0;
    }
    ppJVar1 = pSto + uVar3;
    uVar3 = uVar3 + 1;
  } while (nSize < (*ppJVar1)->pCut[0]);
  return 1;
}

Assistant:

static inline int Jf_ObjHasCutWithSize( Jf_Cut_t ** pSto, int c, int nSize )
{
    int i;
    for ( i = 0; i < c; i++ )
        if ( pSto[i]->pCut[0] <= nSize )
            return 1;
    return 0;
}